

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O3

object_ptr __thiscall mjs::global_object::validate_object(global_object *this,value *v)

{
  gc_heap *this_00;
  native_error_exception *this_01;
  value *in_RDX;
  value *extraout_RDX;
  object_ptr oVar1;
  wostringstream woss;
  wstring local_1f8;
  wstring_view local_1d8;
  wchar_t *local_1c8;
  size_t local_1c0;
  wstring_view local_1a8;
  wostringstream local_198 [376];
  
  if (in_RDX->type_ == object) {
    this_00 = (in_RDX->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_
    ;
    (this->super_object)._vptr_object = (_func_int **)this_00;
    *(undefined4 *)&(this->super_object).heap_ = *(undefined4 *)((long)&in_RDX->field_1 + 8);
    if (this_00 != (gc_heap *)0x0) {
      gc_heap::attach(this_00,(gc_heap_ptr_untyped *)this);
      in_RDX = extraout_RDX;
    }
    oVar1.super_gc_heap_ptr_untyped._8_8_ = in_RDX;
    oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
    return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
  }
  std::__cxx11::wostringstream::wostringstream(local_198);
  debug_print((wostream *)local_198,in_RDX,2,1,0);
  std::operator<<((wostream *)local_198," is not an object");
  this_01 = (native_error_exception *)__cxa_allocate_exception(0x58);
  stack_trace_abi_cxx11_(&local_1f8,(global_object *)v);
  local_1d8._M_len = local_1f8._M_string_length;
  local_1d8._M_str = local_1f8._M_dataplus._M_p;
  std::__cxx11::wstringbuf::str();
  local_1a8._M_len = local_1c0;
  local_1a8._M_str = local_1c8;
  native_error_exception::native_error_exception(this_01,type,&local_1d8,&local_1a8);
  __cxa_throw(this_01,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

object_ptr global_object::validate_object(const value& v) const {
    if (v.type() == value_type::object) {
        return v.object_value();
    }
    std::wostringstream woss;
    mjs::debug_print(woss, v, 2, 1);
    woss << " is not an object";
    throw native_error_exception(native_error_type::type, stack_trace(), woss.str());
}